

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O2

CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
          (CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,Scalar *s)

{
  Scalar SVar1;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar2;
  long lVar3;
  uint __line;
  long lVar4;
  char *__assertion;
  
  pMVar2 = this->m_xpr;
  lVar4 = this->m_col;
  lVar3 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols;
  if (lVar4 == lVar3) {
    lVar4 = this->m_row + this->m_currentBlockRows;
    this->m_row = lVar4;
    this->m_col = 0;
    this->m_currentBlockRows = 1;
    if ((pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
        <= lVar4) {
      __assertion = 
      "m_row<m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\"";
      __line = 0x42;
      goto LAB_0010579b;
    }
    lVar4 = 0;
  }
  if (lVar4 < lVar3) {
    if (this->m_currentBlockRows == 1) {
      SVar1 = *s;
      this->m_col = lVar4 + 1;
      (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
      [lVar4 * (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows + this->m_row] = SVar1;
      return this;
    }
    __assertion = "m_currentBlockRows==1";
    __line = 0x46;
  }
  else {
    __assertion = 
    "m_col<m_xpr.cols() && \"Too many coefficients passed to comma initializer (operator<<)\"";
    __line = 0x45;
  }
LAB_0010579b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/CommaInitializer.h"
                ,__line,
                "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::operator,(const Scalar &) [MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

CommaInitializer& operator,(const Scalar& s)
  {
    if (m_col==m_xpr.cols())
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = 1;
      eigen_assert(m_row<m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert(m_col<m_xpr.cols()
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==1);
    m_xpr.coeffRef(m_row, m_col++) = s;
    return *this;
  }